

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O3

int png_colorspace_endpoints_match(png_xy *xy1,png_xy *xy2,int delta)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = 0;
  uVar2 = 0;
  if ((((xy1->whitex <= xy2->whitex + delta && xy2->whitex - delta <= xy1->whitex) &&
       (xy1->whitey <= xy2->whitey + delta && xy2->whitey - delta <= xy1->whitey)) &&
      (xy1->redx <= xy2->redx + delta && xy2->redx - delta <= xy1->redx)) &&
     (((uVar1 = uVar2, xy1->redy <= xy2->redy + delta && xy2->redy - delta <= xy1->redy &&
       (xy1->greenx <= xy2->greenx + delta && xy2->greenx - delta <= xy1->greenx)) &&
      ((xy1->greeny <= xy2->greeny + delta && xy2->greeny - delta <= xy1->greeny &&
       (xy1->bluex <= xy2->bluex + delta && xy2->bluex - delta <= xy1->bluex)))))) {
    uVar1 = (uint)(xy1->bluey <= xy2->bluey + delta && xy2->bluey - delta <= xy1->bluey);
  }
  return uVar1;
}

Assistant:

static int
png_colorspace_endpoints_match(const png_xy *xy1, const png_xy *xy2, int delta)
{
   /* Allow an error of +/-0.01 (absolute value) on each chromaticity */
   if (PNG_OUT_OF_RANGE(xy1->whitex, xy2->whitex,delta) ||
       PNG_OUT_OF_RANGE(xy1->whitey, xy2->whitey,delta) ||
       PNG_OUT_OF_RANGE(xy1->redx,   xy2->redx,  delta) ||
       PNG_OUT_OF_RANGE(xy1->redy,   xy2->redy,  delta) ||
       PNG_OUT_OF_RANGE(xy1->greenx, xy2->greenx,delta) ||
       PNG_OUT_OF_RANGE(xy1->greeny, xy2->greeny,delta) ||
       PNG_OUT_OF_RANGE(xy1->bluex,  xy2->bluex, delta) ||
       PNG_OUT_OF_RANGE(xy1->bluey,  xy2->bluey, delta))
      return 0;
   return 1;
}